

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void __thiscall
pybind11::detail::function_call::function_call(function_call *this,function_record *f,handle p)

{
  function_record *f_local;
  function_call *this_local;
  handle p_local;
  
  this->func = f;
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::vector(&this->args);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->args_convert);
  object::object(&this->args_ref);
  object::object(&this->kwargs_ref);
  (this->parent).m_ptr = p.m_ptr;
  handle::handle(&this->init_self);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
            (&this->args,(ulong)f->nargs);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this->args_convert,(ulong)f->nargs);
  return;
}

Assistant:

inline function_call::function_call(const function_record &f, handle p) :
        func(f), parent(p) {
    args.reserve(f.nargs);
    args_convert.reserve(f.nargs);
}